

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cpp
# Opt level: O1

void __thiscall Generator::generateSignal(Generator *this,FunctionDef *def,int index)

{
  long lVar1;
  ArgumentDef *pAVar2;
  Data *pDVar3;
  qsizetype qVar4;
  Data *pDVar5;
  bool bVar6;
  char cVar7;
  char *pcVar8;
  uint uVar9;
  uint uVar10;
  ArgumentDef *pAVar11;
  size_t __size;
  char *pcVar12;
  char *pcVar13;
  long lVar14;
  undefined1 *puVar15;
  ulong uVar16;
  long in_FS_OFFSET;
  QByteArrayView QVar17;
  QByteArrayView QVar18;
  QStringBuilder<QStringBuilder<const_char_(&)[13],_QByteArray_&>,_const_char_(&)[10]> local_90;
  QByteArray local_78;
  QByteArray local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((def->wasCloned != false) || (def->isAbstract != false)) goto LAB_0010d003;
  pcVar8 = (def->type).name.d.ptr;
  pcVar13 = (def->name).d.ptr;
  if (pcVar8 == (char *)0x0) {
    pcVar8 = (char *)&QByteArray::_empty;
  }
  pcVar12 = (this->cdef->super_BaseDef).qualified.d.ptr;
  if (pcVar12 == (char *)0x0) {
    pcVar12 = (char *)&QByteArray::_empty;
  }
  if (pcVar13 == (char *)0x0) {
    pcVar13 = (char *)&QByteArray::_empty;
  }
  fprintf((FILE *)this->out,"\n// SIGNAL %d\n%s %s::%s(",(ulong)(uint)index,pcVar8,pcVar12,pcVar13);
  local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  QByteArray::QByteArray(&local_58,"this",-1);
  if (def->isConst == true) {
    local_90.a.b = &(this->cdef->super_BaseDef).qualified;
    local_90.a.a = (char (*) [13])0x140d28;
    local_90.b = (char (*) [10])0x140d35;
    QStringBuilder<QStringBuilder<const_char_(&)[13],_QByteArray_&>,_const_char_(&)[10]>::
    convertTo<QByteArray>(&local_78,&local_90);
    pcVar8 = local_58.d.ptr;
    pDVar5 = local_58.d.d;
    qVar4 = local_78.d.size;
    pDVar3 = local_78.d.d;
    local_78.d.d = local_58.d.d;
    local_58.d.d = pDVar3;
    local_58.d.ptr = local_78.d.ptr;
    local_78.d.ptr = pcVar8;
    local_78.d.size = local_58.d.size;
    local_58.d.size = qVar4;
    if (&pDVar5->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&pDVar5->super_QArrayData,1,0x10);
      }
    }
    pcVar8 = "const";
  }
  else {
    pcVar8 = "";
  }
  if ((def->arguments).d.size == 0) {
    local_78.d.d = (Data *)anon_var_dwarf_3fa62;
    bVar6 = operator==(&def->normalizedType,(char **)&local_78);
    if ((!bVar6) || (def->isPrivateSignal != false)) goto LAB_0010cc77;
    pcVar13 = local_58.d.ptr;
    if (local_58.d.ptr == (char *)0x0) {
      pcVar13 = (char *)&QByteArray::_empty;
    }
    fprintf((FILE *)this->out,
            ")%s\n{\n    QMetaObject::activate(%s, &staticMetaObject, %d, nullptr);\n}\n",pcVar8,
            pcVar13,(ulong)(uint)index);
  }
  else {
LAB_0010cc77:
    lVar1 = (def->arguments).d.size;
    if (lVar1 == 0) {
      uVar16 = 1;
    }
    else {
      pAVar2 = (def->arguments).d.ptr;
      uVar16 = 1;
      lVar14 = 0;
      pAVar11 = pAVar2;
      do {
        if (lVar14 != 0) {
          fputs(", ",(FILE *)this->out);
        }
        if ((pAVar11->type).name.d.size != 0) {
          pcVar13 = *(char **)((long)&(pAVar2->type).name.d.ptr + lVar14);
          if (pcVar13 == (char *)0x0) {
            pcVar13 = (char *)&QByteArray::_empty;
          }
          fputs(pcVar13,(FILE *)this->out);
        }
        fprintf((FILE *)this->out," _t%d",uVar16);
        if ((pAVar11->rightType).d.size != 0) {
          pcVar13 = *(char **)((long)&(pAVar2->rightType).d.ptr + lVar14);
          if (pcVar13 == (char *)0x0) {
            pcVar13 = (char *)&QByteArray::_empty;
          }
          fputs(pcVar13,(FILE *)this->out);
        }
        pAVar11 = pAVar11 + 1;
        lVar14 = lVar14 + 0xa8;
        uVar16 = (ulong)((int)uVar16 + 1);
      } while (pAVar11 != pAVar2 + lVar1);
    }
    uVar9 = (uint)uVar16;
    if (def->isPrivateSignal != false) {
      if ((def->arguments).d.size != 0) {
        fwrite(", ",2,1,(FILE *)this->out);
      }
      uVar9 = uVar9 + 1;
      fprintf((FILE *)this->out,"QPrivateSignal _t%d",uVar16);
    }
    fprintf((FILE *)this->out,")%s\n{\n",pcVar8);
    if ((def->type).name.d.size != 0) {
      local_78.d.d = (Data *)anon_var_dwarf_3fa62;
      bVar6 = operator!=(&def->normalizedType,(char **)&local_78);
      if (bVar6) {
        local_78.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_78.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_78.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
        puVar15 = (undefined1 *)(def->normalizedType).d.size;
        if ((puVar15 == (undefined1 *)0x0) ||
           (pcVar8 = (def->normalizedType).d.ptr, pcVar8[(long)(puVar15 + -1)] != '&')) {
          local_78.d.d = (def->normalizedType).d.d;
          local_78.d.ptr = (def->normalizedType).d.ptr;
          local_78.d.size = (qsizetype)puVar15;
          if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            (((QArrayData *)&((local_78.d.d)->super_QArrayData).ref_)->ref_)._q_value.
            super___atomic_base<int>._M_i =
                 (((QArrayData *)&((local_78.d.d)->super_QArrayData).ref_)->ref_)._q_value.
                 super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
        }
        else {
          QVar17.m_data = pcVar8;
          QVar17.m_size = (qsizetype)puVar15;
          QVar18.m_data = "&&";
          QVar18.m_size = 2;
          cVar7 = QtPrivate::endsWith(QVar17,QVar18);
          if (cVar7 == '\0') {
            puVar15 = puVar15 + -1;
          }
          else {
            puVar15 = puVar15 + -2;
          }
          QByteArray::left(&local_78,&def->normalizedType,(qsizetype)puVar15);
        }
        pcVar8 = local_78.d.ptr;
        if (local_78.d.ptr == (char *)0x0) {
          pcVar8 = (char *)&QByteArray::_empty;
        }
        fprintf((FILE *)this->out,"    %s _t0{};\n",pcVar8);
        if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,1,0x10);
          }
        }
      }
    }
    pcVar8 = (def->normalizedType).d.ptr;
    if (pcVar8 == (char *)0x0) {
      pcVar8 = (char *)&QByteArray::_empty;
    }
    pcVar13 = local_58.d.ptr;
    if (local_58.d.ptr == (char *)0x0) {
      pcVar13 = (char *)&QByteArray::_empty;
    }
    fprintf((FILE *)this->out,"    QMetaObject::activate<%s>(%s, &staticMetaObject, %d, ",pcVar8,
            pcVar13,(ulong)(uint)index);
    local_78.d.d = (Data *)anon_var_dwarf_3fa62;
    bVar6 = operator==(&def->normalizedType,(char **)&local_78);
    if (bVar6) {
      pcVar8 = "nullptr";
      __size = 7;
    }
    else {
      pcVar8 = "std::addressof(_t0)";
      __size = 0x13;
    }
    fwrite(pcVar8,__size,1,(FILE *)this->out);
    if (1 < (int)uVar9) {
      uVar16 = 1;
      do {
        fprintf((FILE *)this->out,", _t%d",uVar16);
        uVar10 = (int)uVar16 + 1;
        uVar16 = (ulong)uVar10;
      } while (uVar9 != uVar10);
    }
    fwrite(");\n",3,1,(FILE *)this->out);
    local_78.d.d = (Data *)anon_var_dwarf_3fa62;
    bVar6 = operator!=(&def->normalizedType,(char **)&local_78);
    if (bVar6) {
      fwrite("    return _t0;\n",0x10,1,(FILE *)this->out);
    }
    fwrite("}\n",2,1,(FILE *)this->out);
  }
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,1,0x10);
    }
  }
LAB_0010d003:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void Generator::generateSignal(const FunctionDef *def, int index)
{
    if (def->wasCloned || def->isAbstract)
        return;
    fprintf(out, "\n// SIGNAL %d\n%s %s::%s(",
            index, def->type.name.constData(), cdef->qualified.constData(), def->name.constData());

    QByteArray thisPtr = "this";
    const char *constQualifier = "";

    if (def->isConst) {
        thisPtr = "const_cast< " + cdef->qualified + " *>(this)";
        constQualifier = "const";
    }

    Q_ASSERT(!def->normalizedType.isEmpty());
    if (def->arguments.isEmpty() && def->normalizedType == "void" && !def->isPrivateSignal) {
        fprintf(out, ")%s\n{\n"
                "    QMetaObject::activate(%s, &staticMetaObject, %d, nullptr);\n"
                "}\n", constQualifier, thisPtr.constData(), index);
        return;
    }

    int offset = 1;
    const auto begin = def->arguments.cbegin();
    const auto end = def->arguments.cend();
    for (auto it = begin; it != end; ++it) {
        const ArgumentDef &a = *it;
        if (it != begin)
            fputs(", ", out);
        if (a.type.name.size())
            fputs(a.type.name.constData(), out);
        fprintf(out, " _t%d", offset++);
        if (a.rightType.size())
            fputs(a.rightType.constData(), out);
    }
    if (def->isPrivateSignal) {
        if (!def->arguments.isEmpty())
            fprintf(out, ", ");
        fprintf(out, "QPrivateSignal _t%d", offset++);
    }

    fprintf(out, ")%s\n{\n", constQualifier);
    if (def->type.name.size() && def->normalizedType != "void") {
        QByteArray returnType = noRef(def->normalizedType);
        fprintf(out, "    %s _t0{};\n", returnType.constData());
    }

    fprintf(out, "    QMetaObject::activate<%s>(%s, &staticMetaObject, %d, ",
            def->normalizedType.constData(), thisPtr.constData(), index);
    if (def->normalizedType == "void") {
        fprintf(out, "nullptr");
    } else {
        fprintf(out, "std::addressof(_t0)");
    }
    int i;
    for (i = 1; i < offset; ++i)
        fprintf(out, ", _t%d", i);
    fprintf(out, ");\n");

    if (def->normalizedType != "void")
        fprintf(out, "    return _t0;\n");
    fprintf(out, "}\n");
}